

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

TRef crec_reassoc_ofs(jit_State *J,TRef tr,ptrdiff_t *ofsp,MSize sz)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  ulong in_R8;
  long lVar5;
  
  uVar2 = (uint)ofsp;
  if ((tr >> 0x10 & 1) != 0) {
    uVar4 = (ulong)ofsp & 0xffff;
    lVar5 = (long)*(short *)((long)&(&(J->cur).nextgc)[uVar4].gcptr64 + 2);
    if (-1 < lVar5) {
      bVar1 = *(byte *)((long)&(&(J->cur).nextgc)[uVar4].gcptr64 + 5);
      if (((ulong)bVar1 < 0x37) && ((0x60020000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        if (*(char *)((long)&(&(J->cur).nextgc)[lVar5].gcptr64 + 5) == '\x1d') {
          lVar5 = *(long *)(&(J->cur).marked + lVar5 * 8);
        }
        else {
          lVar5 = (long)(int)(&(J->cur).nextgc)[lVar5].gcptr64;
        }
        lVar5 = lVar5 * (in_R8 & 0xffffffff);
        lVar3 = -lVar5;
        if (bVar1 != 0x36) {
          lVar3 = lVar5;
        }
        *(long *)CONCAT44(in_register_0000000c,sz) =
             *(long *)CONCAT44(in_register_0000000c,sz) + lVar3;
        uVar2 = (uint)(ushort)(&(J->cur).nextgc)[uVar4].gcptr64;
      }
    }
  }
  return uVar2;
}

Assistant:

static TRef crec_reassoc_ofs(jit_State *J, TRef tr, ptrdiff_t *ofsp, MSize sz)
{
  IRIns *ir = IR(tref_ref(tr));
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD) && irref_isk(ir->op2) &&
      (ir->o == IR_ADD || ir->o == IR_ADDOV || ir->o == IR_SUBOV)) {
    IRIns *irk = IR(ir->op2);
    ptrdiff_t k;
    if (LJ_64 && irk->o == IR_KINT64)
      k = (ptrdiff_t)ir_kint64(irk)->u64 * sz;
    else
      k = (ptrdiff_t)irk->i * sz;
    if (ir->o == IR_SUBOV) *ofsp -= k; else *ofsp += k;
    tr = ir->op1;  /* Not a TRef, but the caller doesn't care. */
  }
  return tr;
}